

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,void *dict,size_t dictSize)

{
  uint uVar1;
  void *workSpace;
  FSE_repeat FVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  void *pvVar10;
  U32 *pUVar11;
  ulong uVar12;
  uint matchlengthMaxValue;
  uint matchlengthLog;
  uint offcodeMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_100;
  uint local_fc;
  void *local_f8;
  uint local_ec;
  uint local_e8 [28];
  uint local_78 [18];
  
  local_ec = 0x1f;
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  local_e8[0] = 0xff;
  local_78[0] = 1;
  sVar3 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8,local_78);
  if (local_78[0] == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  sVar4 = 0;
  if (0xfe < local_e8[0] && sVar3 < 0xffffffffffffff89) {
    sVar4 = sVar3;
  }
  sVar9 = 0xffffffffffffffe2;
  if (0xfe < local_e8[0] && sVar3 < 0xffffffffffffff89) {
    uVar12 = dictSize + (long)dict;
    pvVar10 = (void *)((long)dict + 8 + sVar4);
    local_f8 = workspace;
    sVar3 = FSE_readNCount((short *)local_78,&local_ec,local_e8,pvVar10,uVar12 - (long)pvVar10);
    if ((sVar3 < 0xffffffffffffff89) && (local_e8[0] < 9)) {
      sVar4 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.offcodeCTable,(short *)local_78,0x1f,local_e8[0],local_f8
                         ,0x1900);
      pvVar10 = (void *)(sVar3 + (long)pvVar10);
      if (sVar4 < 0xffffffffffffff89) {
        local_100 = 0x34;
        sVar3 = FSE_readNCount((short *)local_e8,&local_100,&local_fc,pvVar10,uVar12 - (long)pvVar10
                              );
        if (((sVar3 < 0xffffffffffffff89) && (local_fc < 10)) &&
           (sVar4 = FSE_buildCTable_wksp
                              ((bs->entropy).fse.matchlengthCTable,(short *)local_e8,local_100,
                               local_fc,local_f8,0x1900), workSpace = local_f8,
           sVar4 < 0xffffffffffffff89)) {
          FVar2 = FSE_repeat_check;
          if (0x33 < local_100) {
            lVar6 = 0;
            do {
              if (*(short *)((long)local_e8 + lVar6 * 2) == 0) goto LAB_001b5325;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x35);
            FVar2 = FSE_repeat_valid;
          }
LAB_001b5325:
          (bs->entropy).fse.matchlength_repeatMode = FVar2;
          pvVar10 = (void *)((long)pvVar10 + sVar3);
          local_100 = 0x23;
          local_f8 = (void *)FSE_readNCount((short *)local_e8,&local_100,&local_fc,pvVar10,
                                            uVar12 - (long)pvVar10);
          if (((local_f8 < 0xffffffffffffff89) && (local_fc < 10)) &&
             (sVar3 = FSE_buildCTable_wksp
                                ((bs->entropy).fse.litlengthCTable,(short *)local_e8,local_100,
                                 local_fc,workSpace,0x1900), sVar3 < 0xffffffffffffff89)) {
            FVar2 = FSE_repeat_check;
            if (0x22 < local_100) {
              lVar6 = 0;
              do {
                if (*(short *)((long)local_e8 + lVar6 * 2) == 0) goto LAB_001b53bf;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0x24);
              FVar2 = FSE_repeat_valid;
            }
LAB_001b53bf:
            (bs->entropy).fse.litlength_repeatMode = FVar2;
            uVar5 = (long)pvVar10 + (long)local_f8 + 0xcU;
            if (uVar5 <= uVar12) {
              pUVar11 = (U32 *)((long)pvVar10 + (long)local_f8);
              bs->rep[0] = *pUVar11;
              bs->rep[1] = pUVar11[1];
              uVar12 = uVar12 - uVar5;
              uVar7 = (int)uVar12 + 0x20000;
              uVar1 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
                }
              }
              uVar7 = 0x1f;
              if (uVar12 >> 0x11 < 0x7fff) {
                uVar7 = uVar1;
              }
              bs->rep[2] = pUVar11[2];
              FVar2 = FSE_repeat_check;
              if (uVar7 <= local_ec) {
                uVar8 = 0;
                do {
                  if (*(short *)((long)local_78 + uVar8 * 2) == 0) goto LAB_001b5445;
                  uVar8 = uVar8 + 1;
                } while (uVar7 + 1 != uVar8);
                FVar2 = FSE_repeat_valid;
              }
LAB_001b5445:
              (bs->entropy).fse.offcode_repeatMode = FVar2;
              lVar6 = 0;
              do {
                if ((ulong)bs->rep[lVar6] == 0) {
                  return 0xffffffffffffffe2;
                }
                if (uVar12 < bs->rep[lVar6]) {
                  return 0xffffffffffffffe2;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              sVar9 = uVar5 - (long)dict;
            }
          }
        }
      }
    }
  }
  return sVar9;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         const void* const dict, size_t dictSize)
{
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted, "");
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.matchlength_repeatMode = ZSTD_dictNCountRepeat(matchlengthNCount, matchlengthMaxValue, MaxML);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.litlength_repeatMode = ZSTD_dictNCountRepeat(litlengthNCount, litlengthMaxValue, MaxLL);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable for a valid table */
        bs->entropy.fse.offcode_repeatMode = ZSTD_dictNCountRepeat(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff));

        /* All repCodes must be <= dictContentSize and != 0 */
        {   U32 u;
            for (u=0; u<3; u++) {
                RETURN_ERROR_IF(bs->rep[u] == 0, dictionary_corrupted, "");
                RETURN_ERROR_IF(bs->rep[u] > dictContentSize, dictionary_corrupted, "");
    }   }   }

    return dictPtr - (const BYTE*)dict;
}